

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O0

void crnlib::file_utils::combine_path(dynamic_string *dst,char *pA,char *pB)

{
  bool bVar1;
  char c_00;
  uint uVar2;
  char c;
  undefined1 local_30 [8];
  dynamic_string temp;
  char *pB_local;
  char *pA_local;
  dynamic_string *dst_local;
  
  temp.m_pStr = pB;
  dynamic_string::dynamic_string((dynamic_string *)local_30,pA);
  bVar1 = dynamic_string::is_empty((dynamic_string *)local_30);
  if ((!bVar1) && (bVar1 = is_path_separator(*temp.m_pStr), !bVar1)) {
    uVar2 = dynamic_string::get_len((dynamic_string *)local_30);
    c_00 = dynamic_string::operator[]((dynamic_string *)local_30,uVar2 - 1);
    bVar1 = is_path_separator(c_00);
    if (!bVar1) {
      dynamic_string::append_char((dynamic_string *)local_30,'/');
    }
  }
  dynamic_string::operator+=((dynamic_string *)local_30,temp.m_pStr);
  dynamic_string::swap(dst,(dynamic_string *)local_30);
  dynamic_string::~dynamic_string((dynamic_string *)local_30);
  return;
}

Assistant:

void file_utils::combine_path(dynamic_string& dst, const char* pA, const char* pB)
    {
        dynamic_string temp(pA);
        if ((!temp.is_empty()) && (!is_path_separator(pB[0])))
        {
            char c = temp[temp.get_len() - 1];
            if (!is_path_separator(c))
            {
                temp.append_char(CRNLIB_PATH_SEPERATOR_CHAR);
            }
        }
        temp += pB;
        dst.swap(temp);
    }